

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O1

bool __thiscall
Rml::HandleEdgeMarginParser::Parse
          (HandleEdgeMarginParser *this,String *value,Array<NumericValue,_4> *out_constraints)

{
  bool bVar1;
  Property *this_00;
  NumericValue NVar2;
  int i;
  long lVar3;
  PropertyDictionary properties;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  TStack_58;
  
  PropertyDictionary::PropertyDictionary((PropertyDictionary *)&TStack_58);
  bVar1 = PropertySpecification::ParseShorthandDeclaration
                    (&this->specification,(PropertyDictionary *)&TStack_58,this->id_constraint,value
                    );
  if (bVar1) {
    out_constraints->_M_elems[2].number = 0.0;
    out_constraints->_M_elems[2].unit = UNKNOWN;
    out_constraints->_M_elems[3].number = 0.0;
    out_constraints->_M_elems[3].unit = UNKNOWN;
    out_constraints->_M_elems[0].number = 0.0;
    out_constraints->_M_elems[0].unit = UNKNOWN;
    out_constraints->_M_elems[1].number = 0.0;
    out_constraints->_M_elems[1].unit = UNKNOWN;
    lVar3 = 0;
    do {
      this_00 = PropertyDictionary::GetProperty
                          ((PropertyDictionary *)&TStack_58,(this->ids)._M_elems[lVar3]);
      if (this_00 != (Property *)0x0) {
        NVar2 = Property::GetNumericValue(this_00);
        out_constraints->_M_elems[lVar3] = NVar2;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
  }
  robin_hood::detail::
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  ::destroy(&TStack_58);
  return bVar1;
}

Assistant:

bool Parse(const String& value, Array<NumericValue, 4>& out_constraints)
	{
		PropertyDictionary properties;
		if (!specification.ParseShorthandDeclaration(properties, id_constraint, value))
			return false;

		out_constraints = {};
		for (int i = 0; i < 4; i++)
		{
			if (const Property* p = properties.GetProperty(ids[i]))
				out_constraints[i] = p->GetNumericValue();
		}
		return true;
	}